

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

float FBaseCVar::ToFloat(UCVarValue value,ECVarType type)

{
  double dVar1;
  
  switch(type) {
  case CVAR_Bool:
    value._0_4_ = (uint)value.Float & 1;
    value._4_4_ = 0;
switchD_003579b7_caseD_1:
    return (float)value.Int;
  case CVAR_Int:
    goto switchD_003579b7_caseD_1;
  case CVAR_Float:
    return value.Float;
  case CVAR_String:
    dVar1 = strtod(value.String,(char **)0x0);
    return (float)dVar1;
  default:
    return 0.0;
  }
}

Assistant:

float FBaseCVar::ToFloat (UCVarValue value, ECVarType type)
{
	switch (type)
	{
	case CVAR_Bool:
		return (float)value.Bool;

	case CVAR_Int:
		return (float)value.Int;

	case CVAR_Float:
		return value.Float;

	case CVAR_String:
		return (float)strtod (value.String, NULL);

	case CVAR_GUID:
		return 0.f;

	default:
		return 0.f;
	}
}